

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

void __thiscall
helics::apps::Connector::establishPotentialInterfaces
          (Connector *this,ConnectionsList *possibleConnections)

{
  value_t vVar1;
  size_t sVar2;
  element_type *peVar3;
  _func_int *p_Var4;
  _Elt_pointer pbVar5;
  json_value jVar6;
  int iVar7;
  iterator iVar8;
  _Rb_tree_node_base *p_Var9;
  reference pvVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *uInp;
  pointer pbVar11;
  Connector *pCVar12;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range3;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_R8;
  Federate *pFVar13;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar14;
  char *pcVar15;
  _Elt_pointer possibleFed;
  string_view target;
  string_view commandStr;
  string_view target_00;
  string_view target_01;
  string_view target_02;
  string_view fmt;
  string_view message;
  format_args args;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  aliasList;
  json establishInterfaces;
  undefined1 local_e8 [8];
  undefined1 local_e0 [40];
  pointer local_b8;
  data local_b0;
  data local_a0;
  Connector *local_90;
  _Map_pointer local_88;
  string local_80;
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_> *local_60;
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_> *local_58;
  vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_> *local_50;
  uint64_t local_48 [3];
  
  scanPotentialInterfaces(this,possibleConnections);
  scanPotentialInterfaceTemplates(this,possibleConnections);
  local_90 = this;
  scanUnconnectedInterfaces(this,possibleConnections);
  pbVar11 = (possibleConnections->unknownInputs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_b8 = (possibleConnections->unknownInputs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar11 != local_b8) {
    do {
      local_e0._0_8_ = (pbVar11->_M_dataplus)._M_p;
      local_e8 = (undefined1  [8])pbVar11->_M_string_length;
      iVar8 = CLI::std::
              _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(possibleConnections->potentialInputs)._M_h,(key_type *)local_e8);
      if (iVar8.
          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
          ._M_cur != (__node_type *)0x0) {
        *(undefined1 *)
         ((long)iVar8.
                super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
                ._M_cur + 0x38) = 1;
      }
      target_00._M_str = (char *)possibleConnections;
      target_00._M_len = (size_t)(pbVar11->_M_dataplus)._M_p;
      generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)local_e8,(apps *)pbVar11->_M_string_length,target_00,in_R8);
      for (p_Var9 = (_Rb_tree_node_base *)local_e0._16_8_; p_Var9 != (_Rb_tree_node_base *)local_e0;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        sVar2 = *(size_t *)(p_Var9 + 1);
        if (((sVar2 != pbVar11->_M_string_length) ||
            ((sVar2 != 0 &&
             (iVar7 = bcmp(p_Var9[1]._M_parent,(pbVar11->_M_dataplus)._M_p,sVar2), iVar7 != 0)))) &&
           (iVar8 = CLI::std::
                    _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&(possibleConnections->potentialInputs)._M_h,(key_type *)(p_Var9 + 1)),
           iVar8.
           super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
           ._M_cur != (__node_type *)0x0)) {
          *(undefined1 *)
           ((long)iVar8.
                  super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
                  ._M_cur + 0x38) = 1;
        }
      }
      std::
      _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_e8);
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != local_b8);
  }
  pbVar11 = (possibleConnections->unknownPubs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_b8 = (possibleConnections->unknownPubs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar11 != local_b8) {
    do {
      local_e0._0_8_ = (pbVar11->_M_dataplus)._M_p;
      local_e8 = (undefined1  [8])pbVar11->_M_string_length;
      iVar8 = CLI::std::
              _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(possibleConnections->potentialPubs)._M_h,(key_type *)local_e8);
      if (iVar8.
          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
          ._M_cur != (__node_type *)0x0) {
        *(undefined1 *)
         ((long)iVar8.
                super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
                ._M_cur + 0x38) = 1;
      }
      target_01._M_str = (char *)possibleConnections;
      target_01._M_len = (size_t)(pbVar11->_M_dataplus)._M_p;
      generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)local_e8,(apps *)pbVar11->_M_string_length,target_01,in_R8);
      for (p_Var9 = (_Rb_tree_node_base *)local_e0._16_8_; p_Var9 != (_Rb_tree_node_base *)local_e0;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        sVar2 = *(size_t *)(p_Var9 + 1);
        if (((sVar2 != pbVar11->_M_string_length) ||
            ((sVar2 != 0 &&
             (iVar7 = bcmp(p_Var9[1]._M_parent,(pbVar11->_M_dataplus)._M_p,sVar2), iVar7 != 0)))) &&
           (iVar8 = CLI::std::
                    _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&(possibleConnections->potentialPubs)._M_h,(key_type *)(p_Var9 + 1)),
           iVar8.
           super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
           ._M_cur != (__node_type *)0x0)) {
          *(undefined1 *)
           ((long)iVar8.
                  super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
                  ._M_cur + 0x38) = 1;
        }
      }
      std::
      _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_e8);
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != local_b8);
  }
  pbVar11 = (possibleConnections->unknownEndpoints).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_b8 = (possibleConnections->unknownEndpoints).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar11 != local_b8) {
    do {
      local_e0._0_8_ = (pbVar11->_M_dataplus)._M_p;
      local_e8 = (undefined1  [8])pbVar11->_M_string_length;
      iVar8 = CLI::std::
              _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(possibleConnections->potentialEndpoints)._M_h,(key_type *)local_e8);
      if (iVar8.
          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
          ._M_cur != (__node_type *)0x0) {
        *(undefined1 *)
         ((long)iVar8.
                super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
                ._M_cur + 0x38) = 1;
      }
      target_02._M_str = (char *)possibleConnections;
      target_02._M_len = (size_t)(pbVar11->_M_dataplus)._M_p;
      generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)local_e8,(apps *)pbVar11->_M_string_length,target_02,in_R8);
      for (p_Var9 = (_Rb_tree_node_base *)local_e0._16_8_; p_Var9 != (_Rb_tree_node_base *)local_e0;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        sVar2 = *(size_t *)(p_Var9 + 1);
        if (((sVar2 != pbVar11->_M_string_length) ||
            ((sVar2 != 0 &&
             (iVar7 = bcmp(p_Var9[1]._M_parent,(pbVar11->_M_dataplus)._M_p,sVar2), iVar7 != 0)))) &&
           (iVar8 = CLI::std::
                    _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&(possibleConnections->potentialEndpoints)._M_h,(key_type *)(p_Var9 + 1))
           , iVar8.
             super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
             ._M_cur != (__node_type *)0x0)) {
          *(undefined1 *)
           ((long)iVar8.
                  super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>,_true>
                  ._M_cur + 0x38) = 1;
        }
      }
      std::
      _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_e8);
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != local_b8);
  }
  pCVar12 = local_90;
  peVar3 = (local_90->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (peVar3->super_ValueFederate)._vptr_ValueFederate[-3];
  iVar7 = (**(code **)(*(long *)((long)&(peVar3->super_ValueFederate)._vptr_ValueFederate +
                                (long)p_Var4) + 0x48))
                    ((_func_int *)
                     ((long)&(peVar3->super_ValueFederate)._vptr_ValueFederate + (long)p_Var4),0x10f
                    );
  possibleFed = (possibleConnections->federatesWithPotentialInterfaces).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pbVar5 = (possibleConnections->federatesWithPotentialInterfaces).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (possibleFed != pbVar5) {
    local_b8 = (pointer)(possibleConnections->federatesWithPotentialInterfaces).
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_last;
    local_88 = (possibleConnections->federatesWithPotentialInterfaces).
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    local_50 = &possibleConnections->potentialPublicationTemplates;
    local_58 = &possibleConnections->potentialInputTemplates;
    local_60 = &possibleConnections->potentialEndpointTemplates;
    do {
      pcVar15 = local_e0 + 8;
      local_b0.m_type = null;
      local_b0.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<const_char_(&)[20],_char[20],_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_a0,(char (*) [20])"register_interfaces");
      pvVar10 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>
                          ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            *)&local_b0,"command");
      vVar1 = (pvVar10->m_data).m_type;
      (pvVar10->m_data).m_type = local_a0.m_type;
      jVar6 = (pvVar10->m_data).m_value;
      (pvVar10->m_data).m_value = local_a0.m_value;
      local_a0.m_type = vVar1;
      local_a0.m_value = jVar6;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_a0);
      local_e8 = (undefined1  [8])pcVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"inputs","");
      peVar3 = (pCVar12->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar3 == (element_type *)0x0) {
        pFVar13 = (Federate *)0x0;
      }
      else {
        pFVar13 = (Federate *)
                  ((long)&(peVar3->super_ValueFederate)._vptr_ValueFederate +
                  (long)(peVar3->super_ValueFederate)._vptr_ValueFederate[-3]);
      }
      addUsedPotentialInterfaceToCommand
                ((json *)&local_b0,
                 (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
                  *)(possibleConnections->potentialInputs)._M_h._M_before_begin._M_nxt,possibleFed,
                 iVar7,(string *)local_e8,pFVar13);
      if (local_e8 != (undefined1  [8])pcVar15) {
        operator_delete((void *)local_e8,(ulong)(local_e0._8_8_ + 1));
      }
      local_e8 = (undefined1  [8])pcVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"publications","");
      peVar3 = (pCVar12->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar3 == (element_type *)0x0) {
        pFVar13 = (Federate *)0x0;
      }
      else {
        pFVar13 = (Federate *)
                  ((long)&(peVar3->super_ValueFederate)._vptr_ValueFederate +
                  (long)(peVar3->super_ValueFederate)._vptr_ValueFederate[-3]);
      }
      addUsedPotentialInterfaceToCommand
                ((json *)&local_b0,
                 (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
                  *)(possibleConnections->potentialPubs)._M_h._M_before_begin._M_nxt,possibleFed,
                 iVar7,(string *)local_e8,pFVar13);
      if (local_e8 != (undefined1  [8])pcVar15) {
        operator_delete((void *)local_e8,(ulong)(local_e0._8_8_ + 1));
      }
      local_e8 = (undefined1  [8])pcVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"endpoints","");
      peVar3 = (pCVar12->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar3 == (element_type *)0x0) {
        pFVar13 = (Federate *)0x0;
      }
      else {
        pFVar13 = (Federate *)
                  ((long)&(peVar3->super_ValueFederate)._vptr_ValueFederate +
                  (long)(peVar3->super_ValueFederate)._vptr_ValueFederate[-3]);
      }
      addUsedPotentialInterfaceToCommand
                ((json *)&local_b0,
                 (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
                  *)(possibleConnections->potentialEndpoints)._M_h._M_before_begin._M_nxt,
                 possibleFed,iVar7,(string *)local_e8,pFVar13);
      if (local_e8 != (undefined1  [8])pcVar15) {
        operator_delete((void *)local_e8,(ulong)(local_e0._8_8_ + 1));
      }
      local_e8 = (undefined1  [8])pcVar15;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,"templated_publications","");
      peVar3 = (pCVar12->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar3 == (element_type *)0x0) {
        pFVar13 = (Federate *)0x0;
      }
      else {
        pFVar13 = (Federate *)
                  ((long)&(peVar3->super_ValueFederate)._vptr_ValueFederate +
                  (long)(peVar3->super_ValueFederate)._vptr_ValueFederate[-3]);
      }
      addUsedPotentialInterfaceTemplates
                ((json *)&local_b0,local_50,possibleFed,iVar7,(string *)local_e8,pFVar13);
      if (local_e8 != (undefined1  [8])pcVar15) {
        operator_delete((void *)local_e8,(ulong)(local_e0._8_8_ + 1));
      }
      local_e8 = (undefined1  [8])pcVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"templated_inputs","");
      peVar3 = (pCVar12->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar3 == (element_type *)0x0) {
        pFVar13 = (Federate *)0x0;
      }
      else {
        pFVar13 = (Federate *)
                  ((long)&(peVar3->super_ValueFederate)._vptr_ValueFederate +
                  (long)(peVar3->super_ValueFederate)._vptr_ValueFederate[-3]);
      }
      addUsedPotentialInterfaceTemplates
                ((json *)&local_b0,local_58,possibleFed,iVar7,(string *)local_e8,pFVar13);
      if (local_e8 != (undefined1  [8])pcVar15) {
        operator_delete((void *)local_e8,(ulong)(local_e0._8_8_ + 1));
      }
      local_e8 = (undefined1  [8])pcVar15;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"templated_endpoints","");
      peVar3 = (pCVar12->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar3 == (element_type *)0x0) {
        pFVar13 = (Federate *)0x0;
      }
      else {
        pFVar13 = (Federate *)
                  ((long)&(peVar3->super_ValueFederate)._vptr_ValueFederate +
                  (long)(peVar3->super_ValueFederate)._vptr_ValueFederate[-3]);
      }
      addUsedPotentialInterfaceTemplates
                ((json *)&local_b0,local_60,possibleFed,iVar7,(string *)local_e8,pFVar13);
      if (local_e8 != (undefined1  [8])pcVar15) {
        operator_delete((void *)local_e8,(ulong)(local_e0._8_8_ + 1));
      }
      fileops::generateJsonString((string *)local_e8,(json *)&local_b0,true);
      peVar3 = (pCVar12->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      aVar14.values_ = (value<fmt::v11::context> *)0x0;
      target._M_str = (possibleFed->_M_dataplus)._M_p;
      target._M_len = possibleFed->_M_string_length;
      commandStr._M_str = (char *)local_e8;
      commandStr._M_len = local_e0._0_8_;
      Federate::sendCommand
                ((Federate *)
                 ((long)&(peVar3->super_ValueFederate)._vptr_ValueFederate +
                 (long)(peVar3->super_ValueFederate)._vptr_ValueFederate[-3]),target,commandStr,
                 HELICS_SEQUENCING_MODE_FAST);
      if (5 < iVar7) {
        peVar3 = (pCVar12->super_App).fed.
                 super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var4 = (peVar3->super_ValueFederate)._vptr_ValueFederate[-3];
        local_48[0] = pCVar12->interfacesRequested;
        fmt.size_ = 4;
        fmt.data_ = (char *)0x17;
        args.field_1.values_ = aVar14.values_;
        args.desc_ = (unsigned_long_long)local_48;
        ::fmt::v11::vformat_abi_cxx11_(&local_80,(v11 *)"{} interfaces requested",fmt,args);
        message._M_str = local_80._M_dataplus._M_p;
        message._M_len = local_80._M_string_length;
        Federate::logMessage
                  ((Federate *)
                   ((long)&(peVar3->super_ValueFederate)._vptr_ValueFederate + (long)p_Var4),6,
                   message);
        pCVar12 = local_90;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_e8 != (undefined1  [8])(local_e0 + 8)) {
        operator_delete((void *)local_e8,(ulong)(local_e0._8_8_ + 1));
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_b0);
      possibleFed = possibleFed + 1;
      if (possibleFed == (_Elt_pointer)local_b8) {
        possibleFed = local_88[1];
        local_88 = local_88 + 1;
        local_b8 = (pointer)(possibleFed + 0x10);
      }
    } while (possibleFed != pbVar5);
  }
  return;
}

Assistant:

void Connector::establishPotentialInterfaces(ConnectionsList& possibleConnections)
{
    scanPotentialInterfaces(possibleConnections);
    scanPotentialInterfaceTemplates(possibleConnections);

    /** now try to match unconnected interfaces to some of the potential ones*/
    scanUnconnectedInterfaces(possibleConnections);
    /** check for unknown interface connections to potential interfaces*/
    scanUnknownInterfaces(possibleConnections);

    const int logLevel = fed->getIntegerProperty(HELICS_PROPERTY_INT_LOG_LEVEL);
    for (auto& possibleFed : possibleConnections.federatesWithPotentialInterfaces) {
        nlohmann::json establishInterfaces;
        establishInterfaces["command"] = "register_interfaces";
        addUsedPotentialInterfaceToCommand(establishInterfaces,
                                           possibleConnections.potentialInputs,
                                           possibleFed,
                                           logLevel,
                                           "inputs",
                                           fed.get());
        addUsedPotentialInterfaceToCommand(establishInterfaces,
                                           possibleConnections.potentialPubs,
                                           possibleFed,
                                           logLevel,
                                           "publications",
                                           fed.get());
        addUsedPotentialInterfaceToCommand(establishInterfaces,
                                           possibleConnections.potentialEndpoints,
                                           possibleFed,
                                           logLevel,
                                           "endpoints",
                                           fed.get());

        addUsedPotentialInterfaceTemplates(establishInterfaces,
                                           possibleConnections.potentialPublicationTemplates,
                                           possibleFed,
                                           logLevel,
                                           "templated_publications",
                                           fed.get());
        addUsedPotentialInterfaceTemplates(establishInterfaces,
                                           possibleConnections.potentialInputTemplates,
                                           possibleFed,
                                           logLevel,
                                           "templated_inputs",
                                           fed.get());
        addUsedPotentialInterfaceTemplates(establishInterfaces,
                                           possibleConnections.potentialEndpointTemplates,
                                           possibleFed,
                                           logLevel,
                                           "templated_endpoints",
                                           fed.get());
        const std::string commandStr = fileops::generateJsonString(establishInterfaces);
        fed->sendCommand(possibleFed, commandStr);
        if (logLevel >= HELICS_LOG_LEVEL_SUMMARY) {
            fed->logInfoMessage(fmt::format("{} interfaces requested", interfacesRequested));
        }
    }
}